

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::Hashing::compute_hash_graphics_pipeline
               (StateRecorder *recorder,VkGraphicsPipelineCreateInfo *create_info,Hash *out_hash)

{
  uint uVar1;
  int *piVar2;
  VkPipelineDynamicStateCreateInfo *pVVar3;
  VkPipelineDepthStencilStateCreateInfo *pVVar4;
  VkPipelineInputAssemblyStateCreateInfo *pVVar5;
  VkPipelineRasterizationStateCreateInfo *pVVar6;
  VkPipelineMultisampleStateCreateInfo *pVVar7;
  VkPipelineViewportStateCreateInfo *pVVar8;
  VkRect2D *pVVar9;
  VkViewport *pVVar10;
  VkPipelineVertexInputStateCreateInfo *pVVar11;
  VkVertexInputAttributeDescription *pVVar12;
  VkVertexInputBindingDescription *pVVar13;
  VkPipelineColorBlendStateCreateInfo *pVVar14;
  VkPipelineTessellationStateCreateInfo *pVVar15;
  undefined8 uVar16;
  bool bVar17;
  byte bVar18;
  byte bVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int *piVar24;
  undefined8 extraout_RDX;
  long lVar25;
  VkGraphicsPipelineLibraryFlagsEXT state_flags;
  uint uVar26;
  int *piVar27;
  ulong uVar28;
  ulong uVar29;
  VkPipelineColorBlendAttachmentState *pVVar30;
  uint uVar31;
  uint uVar32;
  VkBlendFactor VVar33;
  GlobalStateInfo GVar34;
  DynamicStateInfo dynamic_info;
  Hash hash;
  SubpassMeta meta;
  Hasher local_e8;
  byte local_da;
  undefined1 local_d9;
  DynamicStateInfo local_d8;
  Hash local_90;
  VkGraphicsPipelineLibraryFlagsEXT local_88;
  uint local_84;
  ulong *local_80;
  VkPipelineColorBlendStateCreateInfo *local_78;
  DynamicStateInfo local_70;
  
  local_e8.h = 0xaf63bd4c8601b7df;
  piVar24 = (int *)create_info->pNext;
  uVar31 = create_info->flags;
  piVar27 = piVar24;
  if (piVar24 == (int *)0x0) {
    state_flags = 0xf;
  }
  else {
    do {
      if (*piVar27 == 0x3b9fac02) {
        state_flags = 0xf;
        if ((uVar31 >> 0xb & 1) != 0) {
          state_flags = piVar27[4];
        }
        goto LAB_00157cbf;
      }
      piVar2 = piVar27 + 2;
      piVar27 = *(int **)piVar2;
    } while (*(int **)piVar2 != (int *)0x0);
    state_flags = 0xf;
LAB_00157cbf:
    do {
      if (*piVar24 == 0x3ba1f5f5) goto LAB_00157cdb;
      piVar24 = *(int **)(piVar24 + 2);
    } while (piVar24 != (int *)0x0);
  }
  local_e8.h = (ulong)(uVar31 & 0x7ffffc3f) ^ 0xaf63bd4c8601b7df;
LAB_00157cdb:
  if (((uVar31 & 4) != 0) && (create_info->basePipelineHandle != (VkPipeline)0x0)) {
    bVar17 = StateRecorder::get_hash_for_graphics_pipeline_handle
                       (recorder,create_info->basePipelineHandle,&local_90);
    if (!bVar17) {
      return false;
    }
    local_e8.h = ((local_90 & 0xffffffff ^ local_e8.h * 0x100000001b3) * 0x100000001b3 ^
                 local_90 >> 0x20) * 0x100000001b3 ^ (ulong)(uint)create_info->basePipelineIndex;
  }
  local_d8.color_blend_advanced = false;
  local_d8.provoking_vertex_mode = false;
  local_d8.line_rasterization_mode = false;
  local_d8.line_stipple_enable = false;
  local_d8.depth_clip_negative_one_to_one = false;
  local_d8.viewport_w_scaling_enable = false;
  local_d8.viewport_swizzle = false;
  local_d8.coverage_to_color_enable = false;
  local_d8.coverage_to_color_location = false;
  local_d8.coverage_modulation_mode = false;
  local_d8.coverage_modulation_table_enable = false;
  local_d8.coverage_modulation_table = false;
  local_d8.shading_rate_image_enable = false;
  local_d8.representative_fragment_test_enable = false;
  local_d8.coverage_reduction_mode = false;
  local_d8.depth_clamp_range = false;
  local_d8.tessellation_domain_origin = false;
  local_d8.depth_clamp_enable = false;
  local_d8.polygon_mode = false;
  local_d8.rasterization_samples = false;
  local_d8.sample_mask = false;
  local_d8.alpha_to_coverage_enable = false;
  local_d8.alpha_to_one_enable = false;
  local_d8.logic_op_enable = false;
  local_d8.color_blend_enable = false;
  local_d8.color_blend_equation = false;
  local_d8.color_write_mask = false;
  local_d8.rasterization_stream = false;
  local_d8.conservative_rasterization_mode = false;
  local_d8.extra_primitive_overestimation_size = false;
  local_d8.depth_clip_enable = false;
  local_d8.sample_locations_enable = false;
  local_d8.depth_bounds_test_enable = false;
  local_d8.stencil_test_enable = false;
  local_d8.stencil_op = false;
  local_d8.vertex_input = false;
  local_d8.vertex_input_binding_stride = false;
  local_d8.patch_control_points = false;
  local_d8.rasterizer_discard_enable = false;
  local_d8.primitive_restart_enable = false;
  local_d8.logic_op = false;
  local_d8.color_write_enable = false;
  local_d8.depth_bias_enable = false;
  local_d8.discard_rectangle = false;
  local_d8.discard_rectangle_mode = false;
  local_d8.fragment_shading_rate = false;
  local_d8.sample_locations = false;
  local_d8.line_stipple = false;
  local_d8.stencil_compare = false;
  local_d8.stencil_reference = false;
  local_d8.stencil_write_mask = false;
  local_d8.depth_bounds = false;
  local_d8.depth_bias = false;
  local_d8.line_width = false;
  local_d8.blend_constants = false;
  local_d8.scissor = false;
  local_d8.viewport = false;
  local_d8.scissor_count = false;
  local_d8.viewport_count = false;
  local_d8.cull_mode = false;
  local_d8.front_face = false;
  local_d8.depth_test_enable = false;
  local_d8.depth_write_enable = false;
  local_d8.depth_compare_op = false;
  pVVar3 = create_info->pDynamicState;
  if (pVVar3 == (VkPipelineDynamicStateCreateInfo *)0x0) {
    bVar18 = 0;
    bVar19 = 0;
  }
  else {
    parse_dynamic_state_info
              (&local_70,(Hashing *)(ulong)pVVar3->dynamicStateCount,
               (VkPipelineDynamicStateCreateInfo *)pVVar3->pDynamicStates);
    local_d8.stencil_write_mask = local_70.stencil_write_mask;
    local_d8.depth_bounds = local_70.depth_bounds;
    local_d8.depth_bias = local_70.depth_bias;
    local_d8.line_width = local_70.line_width;
    local_d8.blend_constants = local_70.blend_constants;
    local_d8.scissor = local_70.scissor;
    local_d8.stencil_compare = local_70.stencil_compare;
    local_d8.stencil_reference = local_70.stencil_reference;
    local_d8.color_blend_advanced = local_70.color_blend_advanced;
    local_d8.provoking_vertex_mode = local_70.provoking_vertex_mode;
    local_d8.line_rasterization_mode = local_70.line_rasterization_mode;
    local_d8.line_stipple_enable = local_70.line_stipple_enable;
    local_d8.depth_clip_negative_one_to_one = local_70.depth_clip_negative_one_to_one;
    local_d8.viewport_w_scaling_enable = local_70.viewport_w_scaling_enable;
    local_d8.viewport_swizzle = local_70.viewport_swizzle;
    local_d8.coverage_to_color_enable = local_70.coverage_to_color_enable;
    local_d8.coverage_to_color_location = local_70.coverage_to_color_location;
    local_d8.coverage_modulation_mode = local_70.coverage_modulation_mode;
    local_d8.coverage_modulation_table_enable = local_70.coverage_modulation_table_enable;
    local_d8.coverage_modulation_table = local_70.coverage_modulation_table;
    local_d8.shading_rate_image_enable = local_70.shading_rate_image_enable;
    local_d8.representative_fragment_test_enable = local_70.representative_fragment_test_enable;
    local_d8.coverage_reduction_mode = local_70.coverage_reduction_mode;
    local_d8.depth_clamp_range = local_70.depth_clamp_range;
    local_d8.tessellation_domain_origin = local_70.tessellation_domain_origin;
    local_d8.depth_clamp_enable = local_70.depth_clamp_enable;
    local_d8.polygon_mode = local_70.polygon_mode;
    local_d8.rasterization_samples = local_70.rasterization_samples;
    local_d8.sample_mask = local_70.sample_mask;
    local_d8.alpha_to_coverage_enable = local_70.alpha_to_coverage_enable;
    local_d8.alpha_to_one_enable = local_70.alpha_to_one_enable;
    local_d8.logic_op_enable = local_70.logic_op_enable;
    local_d8.color_blend_enable = local_70.color_blend_enable;
    local_d8.color_blend_equation = local_70.color_blend_equation;
    local_d8.color_write_mask = local_70.color_write_mask;
    local_d8.rasterization_stream = local_70.rasterization_stream;
    local_d8.conservative_rasterization_mode = local_70.conservative_rasterization_mode;
    local_d8.extra_primitive_overestimation_size = local_70.extra_primitive_overestimation_size;
    local_d8.depth_clip_enable = local_70.depth_clip_enable;
    local_d8.sample_locations_enable = local_70.sample_locations_enable;
    local_d8.depth_bounds_test_enable = local_70.depth_bounds_test_enable;
    local_d8.stencil_test_enable = local_70.stencil_test_enable;
    local_d8.stencil_op = local_70.stencil_op;
    local_d8.vertex_input = local_70.vertex_input;
    local_d8.vertex_input_binding_stride = local_70.vertex_input_binding_stride;
    local_d8.patch_control_points = local_70.patch_control_points;
    local_d8.rasterizer_discard_enable = local_70.rasterizer_discard_enable;
    local_d8.primitive_restart_enable = local_70.primitive_restart_enable;
    uVar16 = local_d8._16_8_;
    local_d8.logic_op = local_70.logic_op;
    local_d8.color_write_enable = local_70.color_write_enable;
    local_d8.depth_bias_enable = local_70.depth_bias_enable;
    local_d8.discard_rectangle = local_70.discard_rectangle;
    local_d8.discard_rectangle_mode = local_70.discard_rectangle_mode;
    local_d8.fragment_shading_rate = local_70.fragment_shading_rate;
    local_d8.sample_locations = local_70.sample_locations;
    local_d8.line_stipple = local_70.line_stipple;
    local_d8.viewport = local_70.viewport;
    local_d8.scissor_count = local_70.scissor_count;
    local_d8.viewport_count = local_70.viewport_count;
    local_d8.cull_mode = local_70.cull_mode;
    local_d8.front_face = local_70.front_face;
    local_d8.depth_test_enable = local_70.depth_test_enable;
    local_d8.depth_write_enable = local_70.depth_write_enable;
    local_d8.depth_compare_op = local_70.depth_compare_op;
    local_d8.vertex_input = local_70.vertex_input;
    local_d8.rasterizer_discard_enable = local_70.rasterizer_discard_enable;
    bVar19 = local_d8.vertex_input;
    bVar18 = local_d8.rasterizer_discard_enable;
    local_d8._16_8_ = uVar16;
  }
  GVar34 = parse_global_state_info
                     (create_info,(DynamicStateInfo *)(ulong)bVar19,(SubpassMeta *)(ulong)bVar18);
  if ((GVar34._8_3_ >> 8 & 1) == 0) {
    local_90 = 0;
  }
  else {
    bVar17 = StateRecorder::get_hash_for_pipeline_layout(recorder,create_info->layout,&local_90);
    if (!bVar17) {
      return false;
    }
  }
  local_e8.h = (local_90 & 0xffffffff ^ local_e8.h * 0x100000001b3) * 0x100000001b3 ^
               local_90 >> 0x20;
  local_90 = 0;
  local_80 = out_hash;
  if ((((undefined1  [11])GVar34 & (undefined1  [11])0x1) != (undefined1  [11])0x0) &&
     (bVar17 = StateRecorder::get_hash_for_render_pass(recorder,create_info->renderPass,&local_90),
     !bVar17)) {
    return false;
  }
  local_e8.h = (local_90 & 0xffffffff ^ local_e8.h * 0x100000001b3) * 0x100000001b3 ^
               local_90 >> 0x20;
  local_70.stencil_compare = false;
  local_70.stencil_reference = false;
  bVar17 = StateRecorder::Impl::get_subpass_meta_for_pipeline
                     (recorder->impl,create_info,local_90,(SubpassMeta *)&local_70);
  if (!bVar17) {
    return false;
  }
  GVar34 = parse_global_state_info
                     (create_info,(DynamicStateInfo *)((ulong)local_d8._16_8_ >> 0x18 & 0xff),
                      (SubpassMeta *)((ulong)local_d8._16_8_ >> 0x30 & 0xff));
  uVar29 = GVar34._0_8_;
  uVar31 = (uint)CONCAT53((int5)((ulong)extraout_RDX >> 0x18),GVar34._8_3_);
  uVar28 = (ulong)create_info->subpass;
  if (((undefined1  [11])GVar34 & (undefined1  [11])0x1) == (undefined1  [11])0x0) {
    uVar28 = 0;
  }
  uVar20 = (ulong)create_info->stageCount;
  if (((undefined1  [11])GVar34 & (undefined1  [11])0x10000) == (undefined1  [11])0x0) {
    uVar20 = 0;
  }
  uVar20 = uVar20 ^ (uVar28 ^ local_e8.h * 0x100000001b3) * 0x100000001b3;
  pVVar3 = create_info->pDynamicState;
  if (pVVar3 == (VkPipelineDynamicStateCreateInfo *)0x0) {
    local_e8.h = uVar20 * 0x100000001b3;
  }
  else {
    uVar28 = (ulong)pVVar3->dynamicStateCount;
    local_e8.h = (uVar20 * 0x100000001b3 ^ uVar28) * 0x100000001b3 ^ (ulong)pVVar3->flags;
    if (uVar28 != 0) {
      uVar20 = 0;
      do {
        local_e8.h = local_e8.h * 0x100000001b3 ^ (ulong)pVVar3->pDynamicStates[uVar20];
        uVar20 = uVar20 + 1;
      } while (uVar28 != uVar20);
    }
    bVar17 = hash_pnext_chain(recorder,&local_e8,pVVar3->pNext,&local_d8,state_flags);
    if (!bVar17) {
      return false;
    }
  }
  if ((uVar29 >> 0x20 & 1) == 0) {
    local_e8.h = local_e8.h * 0x100000001b3;
  }
  else {
    pVVar4 = create_info->pDepthStencilState;
    if (local_d8.depth_bounds_test_enable == false) {
      uVar28 = (ulong)pVVar4->depthBoundsTestEnable;
    }
    else {
      uVar28 = 0;
    }
    if (local_d8.depth_compare_op == false) {
      uVar20 = (ulong)pVVar4->depthCompareOp;
    }
    else {
      uVar20 = 0;
    }
    if (local_d8.depth_test_enable == false) {
      uVar23 = (ulong)pVVar4->depthTestEnable;
    }
    else {
      uVar23 = 0;
    }
    if (local_d8.depth_write_enable == false) {
      uVar21 = (ulong)pVVar4->depthWriteEnable;
    }
    else {
      uVar21 = 0;
    }
    uVar21 = ((((local_e8.h * 0x100000001b3 ^ (ulong)pVVar4->flags) * 0x100000001b3 ^ uVar28) *
               0x100000001b3 ^ uVar20) * 0x100000001b3 ^ uVar23) * 0x100000001b3 ^ uVar21;
    if (local_d8.stencil_op == true) {
      uVar21 = uVar21 * -0x3aad8475ae2c2d25;
      uVar28 = 0;
    }
    else {
      uVar21 = ((((((uVar21 * 0x100000001b3 ^ (ulong)(pVVar4->front).compareOp) * 0x100000001b3 ^
                   (ulong)(pVVar4->front).depthFailOp) * 0x100000001b3 ^
                  (ulong)(pVVar4->front).failOp) * 0x100000001b3 ^ (ulong)(pVVar4->front).passOp) *
                 0x100000001b3 ^ (ulong)(pVVar4->back).compareOp) * 0x100000001b3 ^
               (ulong)(pVVar4->back).depthFailOp) * 0x100000001b3 ^ (ulong)(pVVar4->back).failOp;
      uVar28 = (ulong)(pVVar4->back).passOp;
    }
    if (local_d8.stencil_test_enable == false) {
      uVar20 = (ulong)pVVar4->stencilTestEnable;
    }
    else {
      uVar20 = 0;
    }
    local_e8.h = (uVar21 * 0x100000001b3 ^ uVar28) * 0x100000001b3 ^ uVar20;
    if ((local_d8.depth_bounds == false) &&
       ((pVVar4->depthBoundsTestEnable == 0 & (local_d8.depth_bounds_test_enable ^ 1U)) == 0)) {
      local_e8.h = (local_e8.h * 0x100000001b3 ^ (ulong)(uint)pVVar4->minDepthBounds) *
                   0x100000001b3 ^ (ulong)(uint)pVVar4->maxDepthBounds;
    }
    if ((pVVar4->stencilTestEnable == 0 & (local_d8.stencil_test_enable ^ 1U)) == 0) {
      if (local_d8.stencil_compare == false) {
        local_e8.h = (local_e8.h * 0x100000001b3 ^ (ulong)(pVVar4->front).compareMask) *
                     0x100000001b3 ^ (ulong)(pVVar4->back).compareMask;
      }
      if (local_d8.stencil_reference == false) {
        local_e8.h = (local_e8.h * 0x100000001b3 ^ (ulong)(pVVar4->front).reference) * 0x100000001b3
                     ^ (ulong)(pVVar4->back).reference;
      }
      if (local_d8.stencil_write_mask == false) {
        local_e8.h = (local_e8.h * 0x100000001b3 ^ (ulong)(pVVar4->front).writeMask) * 0x100000001b3
                     ^ (ulong)(pVVar4->back).writeMask;
      }
    }
    bVar17 = hash_pnext_chain(recorder,&local_e8,pVVar4->pNext,&local_d8,state_flags);
    if (!bVar17) {
      return false;
    }
  }
  if (((undefined1  [11])GVar34 & (undefined1  [11])0x1) == (undefined1  [11])0x0) {
    local_e8.h = local_e8.h * 0x100000001b3;
  }
  else {
    pVVar5 = create_info->pInputAssemblyState;
    if (local_d8.primitive_restart_enable == false) {
      uVar28 = (ulong)pVVar5->primitiveRestartEnable;
    }
    else {
      uVar28 = 0;
    }
    local_e8.h = ((local_e8.h * 0x100000001b3 ^ (ulong)pVVar5->flags) * 0x100000001b3 ^ uVar28) *
                 0x100000001b3 ^ (ulong)pVVar5->topology;
    bVar17 = hash_pnext_chain(recorder,&local_e8,pVVar5->pNext,&local_d8,state_flags);
    if (!bVar17) {
      return false;
    }
  }
  if ((uVar29 >> 0x38 & 1) == 0) {
    local_e8.h = local_e8.h * 0x100000001b3;
    goto LAB_00158282;
  }
  pVVar6 = create_info->pRasterizationState;
  if (local_d8.cull_mode == false) {
    uVar28 = (ulong)pVVar6->cullMode;
  }
  else {
    uVar28 = 0;
  }
  if (local_d8.depth_clamp_enable == false) {
    uVar20 = (ulong)pVVar6->depthClampEnable;
  }
  else {
    uVar20 = 0;
  }
  if (local_d8.front_face == false) {
    uVar23 = (ulong)pVVar6->frontFace;
  }
  else {
    uVar23 = 0;
  }
  if (local_d8.rasterizer_discard_enable == false) {
    uVar21 = (ulong)pVVar6->rasterizerDiscardEnable;
  }
  else {
    uVar21 = 0;
  }
  if (local_d8.polygon_mode == false) {
    uVar22 = (ulong)pVVar6->polygonMode;
  }
  else {
    uVar22 = 0;
  }
  uVar22 = (((((local_e8.h * 0x100000001b3 ^ (ulong)pVVar6->flags) * 0x100000001b3 ^ uVar28) *
              0x100000001b3 ^ uVar20) * 0x100000001b3 ^ uVar23) * 0x100000001b3 ^ uVar21) *
           0x100000001b3 ^ uVar22;
  if (local_d8.depth_bias_enable == true) {
    local_e8.h = uVar22 * 0x100000001b3;
LAB_00158225:
    if (local_d8.depth_bias == false) {
      local_e8.h = ((local_e8.h * 0x100000001b3 ^ (ulong)(uint)pVVar6->depthBiasClamp) *
                    0x100000001b3 ^ (ulong)(uint)pVVar6->depthBiasSlopeFactor) * 0x100000001b3 ^
                   (ulong)(uint)pVVar6->depthBiasConstantFactor;
    }
  }
  else {
    local_e8.h = uVar22 * 0x100000001b3 ^ (ulong)pVVar6->depthBiasEnable;
    if ((ulong)pVVar6->depthBiasEnable != 0) goto LAB_00158225;
  }
  if (local_d8.line_width == false) {
    local_e8.h = local_e8.h * 0x100000001b3 ^ (ulong)(uint)pVVar6->lineWidth;
  }
  bVar17 = hash_pnext_chain(recorder,&local_e8,pVVar6->pNext,&local_d8,state_flags);
  if (!bVar17) {
    return false;
  }
LAB_00158282:
  uVar32 = GVar34._0_4_;
  if ((uVar32 >> 0x18 & 1) != 0) {
    pVVar7 = create_info->pMultisampleState;
    if (local_d8.alpha_to_coverage_enable == false) {
      uVar28 = (ulong)pVVar7->alphaToCoverageEnable;
    }
    else {
      uVar28 = 0;
    }
    if (local_d8.alpha_to_one_enable == false) {
      uVar20 = (ulong)pVVar7->alphaToOneEnable;
    }
    else {
      uVar20 = 0;
    }
    if (local_d8.rasterization_samples == false) {
      uVar23 = (ulong)pVVar7->rasterizationSamples;
    }
    else {
      uVar23 = 0;
    }
    local_e8.h = (((((local_e8.h * 0x100000001b3 ^ (ulong)pVVar7->flags) * 0x100000001b3 ^ uVar28) *
                    0x100000001b3 ^ uVar20) * 0x100000001b3 ^ (ulong)(uint)pVVar7->minSampleShading)
                  * 0x100000001b3 ^ uVar23) * 0x100000001b3 ^ (ulong)pVVar7->sampleShadingEnable;
    if ((local_d8.sample_mask == false) && (pVVar7->pSampleMask != (VkSampleMask *)0x0)) {
      uVar1 = pVVar7->rasterizationSamples +
              (VK_SAMPLE_COUNT_32_BIT|VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|
               VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_2_BIT);
      if (0x3e < uVar1) {
        uVar26 = pVVar7->rasterizationSamples +
                 (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT|
                  VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT);
        if ((int)uVar26 < 0) {
          uVar26 = uVar1;
        }
        uVar28 = 0;
        do {
          local_e8.h = local_e8.h * 0x100000001b3 ^ (ulong)pVVar7->pSampleMask[uVar28];
          uVar28 = uVar28 + 1;
        } while (((int)uVar26 >> 5) + (uint)((int)uVar26 >> 5 == 0) != uVar28);
      }
    }
    else {
      local_e8.h = local_e8.h * 0x100000001b3;
    }
    bVar17 = hash_pnext_chain(recorder,&local_e8,pVVar7->pNext,&local_d8,state_flags);
    if (!bVar17) {
      return false;
    }
  }
  if ((uVar32 >> 0x10 & 1) == 0) {
    local_e8.h = local_e8.h * 0x100000001b3;
  }
  else {
    pVVar8 = create_info->pViewportState;
    if (local_d8.scissor_count == false) {
      uVar28 = (ulong)pVVar8->scissorCount;
    }
    else {
      uVar28 = 0;
    }
    if (local_d8.viewport_count == false) {
      uVar20 = (ulong)pVVar8->viewportCount;
    }
    else {
      uVar20 = 0;
    }
    local_e8.h = ((local_e8.h * 0x100000001b3 ^ (ulong)pVVar8->flags) * 0x100000001b3 ^ uVar28) *
                 0x100000001b3 ^ uVar20;
    if ((local_d8.scissor == false) && ((ulong)pVVar8->scissorCount != 0)) {
      pVVar9 = pVVar8->pScissors;
      lVar25 = 0;
      do {
        local_e8.h = (((local_e8.h * 0x100000001b3 ^
                       (ulong)*(uint *)((long)&(pVVar9->offset).x + lVar25)) * 0x100000001b3 ^
                      (ulong)*(uint *)((long)&(pVVar9->offset).y + lVar25)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&(pVVar9->extent).width + lVar25)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&(pVVar9->extent).height + lVar25);
        lVar25 = lVar25 + 0x10;
      } while ((ulong)pVVar8->scissorCount << 4 != lVar25);
    }
    if ((local_d8.viewport == false) && ((ulong)pVVar8->viewportCount != 0)) {
      pVVar10 = pVVar8->pViewports;
      lVar25 = 0;
      do {
        local_e8.h = (((((local_e8.h * 0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar10->x + lVar25))
                         * 0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar10->y + lVar25)) *
                        0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar10->width + lVar25)) *
                       0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar10->height + lVar25)) *
                      0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar10->minDepth + lVar25)) *
                     0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar10->maxDepth + lVar25);
        lVar25 = lVar25 + 0x18;
      } while ((ulong)pVVar8->viewportCount * 0x18 != lVar25);
    }
    bVar17 = hash_pnext_chain(recorder,&local_e8,pVVar8->pNext,&local_d8,state_flags);
    if (!bVar17) {
      return false;
    }
  }
  if ((uVar29 >> 0x30 & 1) == 0) {
    local_e8.h = local_e8.h * 0x100000001b3;
  }
  else {
    pVVar11 = create_info->pVertexInputState;
    uVar28 = (ulong)pVVar11->vertexBindingDescriptionCount;
    uVar29 = (ulong)pVVar11->vertexAttributeDescriptionCount;
    local_e8.h = ((local_e8.h * 0x100000001b3 ^ (ulong)pVVar11->flags) * 0x100000001b3 ^ uVar29) *
                 0x100000001b3 ^ uVar28;
    if (uVar29 != 0) {
      pVVar12 = pVVar11->pVertexAttributeDescriptions;
      lVar25 = 0;
      do {
        local_e8.h = (((local_e8.h * 0x100000001b3 ^
                       (ulong)*(uint *)((long)&pVVar12->offset + lVar25)) * 0x100000001b3 ^
                      (ulong)*(uint *)((long)&pVVar12->binding + lVar25)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&pVVar12->format + lVar25)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&pVVar12->location + lVar25);
        lVar25 = lVar25 + 0x10;
      } while (uVar29 << 4 != lVar25);
    }
    if (uVar28 != 0) {
      pVVar13 = pVVar11->pVertexBindingDescriptions;
      lVar25 = 0;
      do {
        if (local_d8.vertex_input_binding_stride == false) {
          uVar29 = (ulong)*(uint *)((long)&pVVar13->stride + lVar25);
        }
        else {
          uVar29 = 0;
        }
        local_e8.h = ((local_e8.h * 0x100000001b3 ^
                      (ulong)*(uint *)((long)&pVVar13->binding + lVar25)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&pVVar13->inputRate + lVar25)) * 0x100000001b3 ^ uVar29;
        lVar25 = lVar25 + 0xc;
      } while (uVar28 * 0xc != lVar25);
    }
    bVar17 = hash_pnext_chain(recorder,&local_e8,pVVar11->pNext,&local_d8,state_flags);
    if (!bVar17) {
      return false;
    }
  }
  if (((undefined1  [11])GVar34 & (undefined1  [11])0x10000000000) == (undefined1  [11])0x0) {
    local_e8.h = local_e8.h * 0x100000001b3;
  }
  else {
    pVVar14 = create_info->pColorBlendState;
    uVar28 = (ulong)pVVar14->attachmentCount;
    if (local_d8.logic_op_enable == false) {
      uVar29 = (ulong)pVVar14->logicOpEnable;
    }
    else {
      uVar29 = 0;
    }
    if ((local_d8.logic_op == false) &&
       ((pVVar14->logicOpEnable == 0 & (local_d8.logic_op_enable ^ 1U)) == 0)) {
      uVar20 = (ulong)pVVar14->logicOp;
    }
    else {
      uVar20 = 0;
    }
    local_e8.h = (((local_e8.h * 0x100000001b3 ^ (ulong)pVVar14->flags) * 0x100000001b3 ^ uVar28) *
                  0x100000001b3 ^ uVar29) * 0x100000001b3 ^ uVar20;
    bVar19 = local_d8.color_blend_equation;
    if (((local_d8.color_blend_enable == true) && (local_d8.color_write_mask != false)) &&
       (local_d8.color_blend_equation == true)) {
      local_e8.h = local_e8.h * 0x100000001b3;
    }
    else {
      local_da = local_d8.color_blend_equation;
      if (uVar28 != 0) {
        local_d9 = local_d8.color_blend_advanced;
        pVVar30 = pVVar14->pAttachments;
        uVar29 = 0;
        do {
          if (local_d8.color_blend_enable == false) {
            uVar20 = (ulong)pVVar30->blendEnable;
          }
          else {
            uVar20 = 0;
          }
          if (local_d8.color_write_mask == false) {
            uVar23 = (ulong)pVVar30->colorWriteMask;
          }
          else {
            uVar23 = 0;
          }
          uVar23 = (local_e8.h * 0x100000001b3 ^ uVar20) * 0x100000001b3 ^ uVar23;
          if ((pVVar30->blendEnable == 0 & (local_d8.color_blend_enable ^ 1U)) == 0) {
            if (local_d8.color_blend_equation == false) {
              if ((local_d8._48_8_ & 1) == 0) {
                uVar20 = (ulong)pVVar30->colorBlendOp;
                uVar23 = uVar23 * 0x100000001b3 ^ (ulong)pVVar30->alphaBlendOp;
              }
              else {
                uVar23 = uVar23 * 0x100000001b3;
                uVar20 = 0;
              }
              VVar33 = pVVar30->dstAlphaBlendFactor;
              local_e8.h = ((((uVar23 * 0x100000001b3 ^ uVar20) * 0x100000001b3 ^ (ulong)VVar33) *
                             0x100000001b3 ^ (ulong)pVVar30->srcAlphaBlendFactor) * 0x100000001b3 ^
                           (ulong)pVVar30->dstColorBlendFactor) * 0x100000001b3 ^
                           (ulong)pVVar30->srcColorBlendFactor;
            }
            else {
              local_e8.h = uVar23 * 0x100000001b3;
              VVar33 = pVVar30->dstAlphaBlendFactor;
            }
            if (((((VVar33 == VK_BLEND_FACTOR_CONSTANT_COLOR) ||
                  (VVar33 == VK_BLEND_FACTOR_CONSTANT_ALPHA)) ||
                 ((pVVar30->srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
                  ((pVVar30->srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
                   (pVVar30->dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR)))))) ||
                (pVVar30->dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA)) ||
               ((pVVar30->srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
                (pVVar30->srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR)))) {
              bVar19 = 1;
            }
          }
          else {
            local_e8.h = uVar23 * 0x100000001b3;
          }
          uVar29 = uVar29 + 1;
          pVVar30 = pVVar30 + 1;
          local_88 = state_flags;
          local_78 = pVVar14;
        } while (uVar29 < uVar28);
      }
    }
    if (((bVar19 & 1) != 0) && (local_d8.blend_constants == false)) {
      lVar25 = 0;
      do {
        local_e8.h = local_e8.h * 0x100000001b3 ^
                     (ulong)*(uint *)((long)pVVar14->blendConstants + lVar25);
        lVar25 = lVar25 + 4;
      } while (lVar25 != 0x10);
    }
    local_84 = uVar31;
    bVar17 = hash_pnext_chain(recorder,&local_e8,pVVar14->pNext,&local_d8,state_flags);
    if (!bVar17) {
      return false;
    }
  }
  if ((uVar32 >> 8 & 1) == 0) {
    local_e8.h = local_e8.h * 0x100000001b3;
  }
  else {
    pVVar15 = create_info->pTessellationState;
    if (local_d8.patch_control_points == false) {
      uVar28 = (ulong)pVVar15->patchControlPoints;
    }
    else {
      uVar28 = 0;
    }
    local_e8.h = (local_e8.h * 0x100000001b3 ^ (ulong)pVVar15->flags) * 0x100000001b3 ^ uVar28;
    bVar17 = hash_pnext_chain(recorder,&local_e8,pVVar15->pNext,&local_d8,state_flags);
    if (!bVar17) {
      return false;
    }
  }
  if (((uVar31 >> 0x10 & 1) != 0) && (create_info->stageCount != 0)) {
    lVar25 = 0;
    uVar28 = 0;
    do {
      bVar17 = compute_hash_stage(recorder,&local_e8,
                                  (VkPipelineShaderStageCreateInfo *)
                                  ((long)&create_info->pStages->sType + lVar25));
      if (!bVar17) {
        return false;
      }
      uVar28 = uVar28 + 1;
      lVar25 = lVar25 + 0x30;
    } while (uVar28 < create_info->stageCount);
  }
  bVar17 = hash_pnext_chain(recorder,&local_e8,create_info->pNext,&local_d8,state_flags);
  if (!bVar17) {
    return false;
  }
  *local_80 = local_e8.h;
  return true;
}

Assistant:

bool compute_hash_graphics_pipeline(const StateRecorder &recorder, const VkGraphicsPipelineCreateInfo &create_info, Hash *out_hash)
{
	// Ignore pipelines that cannot result in meaningful replay.
	auto state_flags = graphics_pipeline_get_effective_state_flags(create_info);

	Hasher h;
	Hash hash;

	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, create_info.pNext))
		h.u32(0);
	else
		h.u32(normalize_pipeline_creation_flags(create_info.flags));

	if ((create_info.flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
	    create_info.basePipelineHandle != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_graphics_pipeline_handle(create_info.basePipelineHandle, &hash))
			return false;
		h.u64(hash);
		h.s32(create_info.basePipelineIndex);
	}

	DynamicStateInfo dynamic_info = {};
	if (create_info.pDynamicState)
		dynamic_info = parse_dynamic_state_info(*create_info.pDynamicState);
	GlobalStateInfo global_info = parse_global_state_info(create_info, dynamic_info, { true, true });

	if (global_info.layout_state)
	{
		if (!recorder.get_hash_for_pipeline_layout(create_info.layout, &hash))
			return false;
	}
	else
		hash = 0;

	h.u64(hash);

	// Need to query state info in two stages. Do we ignore render pass? If so, query a 0 hash.
	// If we don't ignore render pass, we can query for subpass meta.
	hash = 0;
	if (global_info.render_pass_state && !recorder.get_hash_for_render_pass(create_info.renderPass, &hash))
		return false;
	h.u64(hash);

	StateRecorder::SubpassMeta meta = {};
	if (!recorder.get_subpass_meta_for_pipeline(create_info, hash, &meta))
		return false;

	global_info = parse_global_state_info(create_info, dynamic_info, meta);

	h.u32(global_info.render_pass_state ? create_info.subpass : 0u);
	h.u32(global_info.module_state ? create_info.stageCount : 0u);

	if (create_info.pDynamicState)
	{
		auto &state = *create_info.pDynamicState;
		h.u32(state.dynamicStateCount);
		h.u32(state.flags);
		for (uint32_t i = 0; i < state.dynamicStateCount; i++)
			h.u32(state.pDynamicStates[i]);
		if (!hash_pnext_chain(&recorder, h, state.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.depth_stencil_state)
	{
		auto &ds = *create_info.pDepthStencilState;
		h.u32(ds.flags);
		h.u32(dynamic_info.depth_bounds_test_enable ? 0 : ds.depthBoundsTestEnable);
		h.u32(dynamic_info.depth_compare_op ? 0 : ds.depthCompareOp);
		h.u32(dynamic_info.depth_test_enable ? 0 : ds.depthTestEnable);
		h.u32(dynamic_info.depth_write_enable ? 0 : ds.depthWriteEnable);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.compareOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.depthFailOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.failOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.passOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.compareOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.depthFailOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.failOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.passOp);
		h.u32(dynamic_info.stencil_test_enable ? 0 : ds.stencilTestEnable);

		if (!dynamic_info.depth_bounds && (ds.depthBoundsTestEnable || dynamic_info.depth_bounds_test_enable))
		{
			h.f32(ds.minDepthBounds);
			h.f32(ds.maxDepthBounds);
		}

		if (ds.stencilTestEnable || dynamic_info.stencil_test_enable)
		{
			if (!dynamic_info.stencil_compare)
			{
				h.u32(ds.front.compareMask);
				h.u32(ds.back.compareMask);
			}

			if (!dynamic_info.stencil_reference)
			{
				h.u32(ds.front.reference);
				h.u32(ds.back.reference);
			}

			if (!dynamic_info.stencil_write_mask)
			{
				h.u32(ds.front.writeMask);
				h.u32(ds.back.writeMask);
			}
		}

		if (!hash_pnext_chain(&recorder, h, ds.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.input_assembly)
	{
		auto &ia = *create_info.pInputAssemblyState;
		h.u32(ia.flags);
		h.u32(dynamic_info.primitive_restart_enable ? 0 : ia.primitiveRestartEnable);
		// Dynamic 3 makes this fully ignored, but it depends on a property. For sanity's sake we need to hash this.
		h.u32(ia.topology);

		if (!hash_pnext_chain(&recorder, h, ia.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.rasterization_state)
	{
		auto &rs = *create_info.pRasterizationState;
		h.u32(rs.flags);
		h.u32(dynamic_info.cull_mode ? 0 : rs.cullMode);
		h.u32(dynamic_info.depth_clamp_enable ? 0 : rs.depthClampEnable);
		h.u32(dynamic_info.front_face ? 0 : rs.frontFace);
		h.u32(dynamic_info.rasterizer_discard_enable ? 0 : rs.rasterizerDiscardEnable);
		h.u32(dynamic_info.polygon_mode ? 0 : rs.polygonMode);
		h.u32(dynamic_info.depth_bias_enable ? 0 : rs.depthBiasEnable);

		if ((rs.depthBiasEnable || dynamic_info.depth_bias_enable) && !dynamic_info.depth_bias)
		{
			h.f32(rs.depthBiasClamp);
			h.f32(rs.depthBiasSlopeFactor);
			h.f32(rs.depthBiasConstantFactor);
		}

		if (!dynamic_info.line_width)
			h.f32(rs.lineWidth);

		if (!hash_pnext_chain(&recorder, h, rs.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.multisample_state)
	{
		auto &ms = *create_info.pMultisampleState;
		h.u32(ms.flags);
		h.u32(dynamic_info.alpha_to_coverage_enable ? 0 : ms.alphaToCoverageEnable);
		h.u32(dynamic_info.alpha_to_one_enable ? 0 : ms.alphaToOneEnable);
		h.f32(ms.minSampleShading);
		h.u32(dynamic_info.rasterization_samples ? 0 : ms.rasterizationSamples);
		h.u32(ms.sampleShadingEnable);
		if (!dynamic_info.sample_mask && ms.pSampleMask)
		{
			uint32_t elems = (ms.rasterizationSamples + 31) / 32;
			for (uint32_t i = 0; i < elems; i++)
				h.u32(ms.pSampleMask[i]);
		}
		else
			h.u32(0);

		if (!hash_pnext_chain(&recorder, h, ms.pNext, &dynamic_info, state_flags))
			return false;
	}

	if (global_info.viewport_state)
	{
		auto &vp = *create_info.pViewportState;
		h.u32(vp.flags);
		h.u32(dynamic_info.scissor_count ? 0 : vp.scissorCount);
		h.u32(dynamic_info.viewport_count ? 0 : vp.viewportCount);

		if (!dynamic_info.scissor)
		{
			for (uint32_t i = 0; i < vp.scissorCount; i++)
			{
				h.s32(vp.pScissors[i].offset.x);
				h.s32(vp.pScissors[i].offset.y);
				h.u32(vp.pScissors[i].extent.width);
				h.u32(vp.pScissors[i].extent.height);
			}
		}

		if (!dynamic_info.viewport)
		{
			for (uint32_t i = 0; i < vp.viewportCount; i++)
			{
				h.f32(vp.pViewports[i].x);
				h.f32(vp.pViewports[i].y);
				h.f32(vp.pViewports[i].width);
				h.f32(vp.pViewports[i].height);
				h.f32(vp.pViewports[i].minDepth);
				h.f32(vp.pViewports[i].maxDepth);
			}
		}

		if (!hash_pnext_chain(&recorder, h, vp.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.vertex_input)
	{
		auto &vi = *create_info.pVertexInputState;
		h.u32(vi.flags);
		h.u32(vi.vertexAttributeDescriptionCount);
		h.u32(vi.vertexBindingDescriptionCount);

		for (uint32_t i = 0; i < vi.vertexAttributeDescriptionCount; i++)
		{
			h.u32(vi.pVertexAttributeDescriptions[i].offset);
			h.u32(vi.pVertexAttributeDescriptions[i].binding);
			h.u32(vi.pVertexAttributeDescriptions[i].format);
			h.u32(vi.pVertexAttributeDescriptions[i].location);
		}

		for (uint32_t i = 0; i < vi.vertexBindingDescriptionCount; i++)
		{
			h.u32(vi.pVertexBindingDescriptions[i].binding);
			h.u32(vi.pVertexBindingDescriptions[i].inputRate);
			h.u32(dynamic_info.vertex_input_binding_stride ? 0 : vi.pVertexBindingDescriptions[i].stride);
		}

		if (!hash_pnext_chain(&recorder, h, vi.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.color_blend_state)
	{
		auto &b = *create_info.pColorBlendState;
		h.u32(b.flags);
		h.u32(b.attachmentCount);
		h.u32(dynamic_info.logic_op_enable ? 0 : b.logicOpEnable);
		h.u32(dynamic_info.logic_op || (!b.logicOpEnable && !dynamic_info.logic_op_enable) ? 0 : b.logicOp);

		bool need_blend_constants = false;

		// Special EDS3 rule. If all of these are set, we must ignore the pAttachments pointer.
		const bool dynamic_attachments = dynamic_info.color_blend_enable &&
		                                 dynamic_info.color_write_mask &&
		                                 dynamic_info.color_blend_equation;

		// If we have dynamic equation, but not dynamic blend constants, we can dynamically set blend constant
		// as input, so we might need to know those constants to hash the PSO.
		if (dynamic_info.color_blend_equation)
			need_blend_constants = true;

		if (dynamic_attachments)
			h.u32(0);

		for (uint32_t i = 0; !dynamic_attachments && i < b.attachmentCount; i++)
		{
			h.u32(dynamic_info.color_blend_enable ? 0 : b.pAttachments[i].blendEnable);
			h.u32(dynamic_info.color_write_mask ? 0 : b.pAttachments[i].colorWriteMask);
			if (b.pAttachments[i].blendEnable || dynamic_info.color_blend_enable)
			{
				if (!dynamic_info.color_blend_equation)
				{
					h.u32(dynamic_info.color_blend_advanced ? 0 : b.pAttachments[i].alphaBlendOp);
					h.u32(dynamic_info.color_blend_advanced ? 0 : b.pAttachments[i].colorBlendOp);
					h.u32(b.pAttachments[i].dstAlphaBlendFactor);
					h.u32(b.pAttachments[i].srcAlphaBlendFactor);
					h.u32(b.pAttachments[i].dstColorBlendFactor);
					h.u32(b.pAttachments[i].srcColorBlendFactor);
				}
				else
					h.u32(0);

				if (b.pAttachments[i].dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				    b.pAttachments[i].srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				    b.pAttachments[i].dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				    b.pAttachments[i].srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR)
				{
					need_blend_constants = true;
				}
			}
			else
				h.u32(0);
		}

		if (need_blend_constants && !dynamic_info.blend_constants)
			for (auto &blend_const : b.blendConstants)
				h.f32(blend_const);

		if (!hash_pnext_chain(&recorder, h, b.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.tessellation_state)
	{
		auto &tess = *create_info.pTessellationState;
		h.u32(tess.flags);
		h.u32(dynamic_info.patch_control_points ? 0 : tess.patchControlPoints);

		if (!hash_pnext_chain(&recorder, h, tess.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.module_state)
	{
		for (uint32_t i = 0; i < create_info.stageCount; i++)
		{
			auto &stage = create_info.pStages[i];
			if (!compute_hash_stage(recorder, h, stage))
				return false;
		}
	}

	if (!hash_pnext_chain(&recorder, h, create_info.pNext, &dynamic_info, state_flags))
		return false;

	*out_hash = h.get();
	return true;
}